

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O3

bool nuraft::raft_server::get_stat_histogram
               (string *name,
               map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *histogram_out)

{
  Histogram *pHVar1;
  stat_elem *psVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  pair<unsigned_long,_unsigned_long> local_40;
  
  stat_mgr::get_instance();
  psVar2 = stat_mgr::get_stat(&stat_mgr::get_instance::mgr_instance,name);
  if ((psVar2 == (stat_elem *)0x0) || (psVar2->stat_type_ != HISTOGRAM)) {
    bVar5 = false;
  }
  else {
    pHVar1 = psVar2->hist_;
    uVar3 = 0xffffffffffffffff;
    lVar4 = 0x40;
    do {
      if (pHVar1->bins[uVar3 + 1].super___atomic_base<unsigned_long>._M_i != 0) {
        if (lVar4 == -1) {
          return true;
        }
        do {
          local_40.second = pHVar1->bins[uVar3 + 1].super___atomic_base<unsigned_long>._M_i;
          if (local_40.second != 0) {
            local_40.first = 1L << ((byte)lVar4 & 0x3f);
            if (uVar3 == 0xffffffffffffffff) {
              local_40.first = 0xffffffffffffffff;
            }
            std::
            _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
            ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                      ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                        *)histogram_out,&local_40);
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + -1;
        } while (uVar3 < 0x40);
        return true;
      }
      uVar3 = uVar3 + 1;
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar5);
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool raft_server::get_stat_histogram(const std::string& name,
                                     std::map<double, uint64_t>& histogram_out ) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return false;
    if (elem->get_type() != stat_elem::HISTOGRAM) return false;

    for (HistItr& entry: *elem->get_histogram()) {
        uint64_t cnt = entry.getCount();
        if (cnt) {
            histogram_out.insert( std::make_pair(entry.getUpperBound(), cnt) );
        }
    }
    return true;
}